

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

string * __thiscall
duckdb::AdditionalProcessInfo_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,FileSystem *fs,pid_t pid)

{
  int iVar1;
  string *psVar2;
  char *pcVar3;
  _Alloc_hider __nptr;
  __pid_t _Var4;
  pointer pFVar5;
  char *pcVar6;
  ssize_t sVar7;
  int *piVar8;
  long lVar9;
  passwd *ppVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  int params_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> loginuid_file;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> cmdline_file;
  string process_name;
  string process_owner;
  string cmdline;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_1208;
  string *local_1200;
  string local_11f8;
  undefined1 *local_11d8;
  char *local_11d0;
  undefined1 local_11c8 [16];
  undefined1 *local_11b8;
  char *local_11b0;
  undefined1 local_11a8 [16];
  string local_1198;
  string local_1178;
  undefined1 *local_1158 [2];
  undefined1 local_1148 [16];
  string local_1138;
  string local_1118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10f8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10e8;
  string local_10d8;
  undefined1 *local_10b8 [2];
  undefined1 local_10a8 [16];
  string local_1098;
  string local_1078;
  string local_1058;
  string local_1038 [128];
  
  _Var4 = getpid();
  params_00 = (int)fs;
  if (_Var4 == params_00) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "Lock is already held in current process, likely another DuckDB instance","");
    return __return_storage_ptr__;
  }
  local_11d8 = local_11c8;
  local_11d0 = (char *)0x0;
  local_11c8[0] = 0;
  local_11b8 = local_11a8;
  local_11b0 = (char *)0x0;
  local_11a8[0] = 0;
  local_1200 = __return_storage_ptr__;
  local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,"/proc/%d/cmdline","");
  Exception::ConstructMessage<int>(local_1038,&local_1058,params_00);
  (**(code **)(*(long *)this + 0x10))(&local_11f8,this,local_1038,1,0x100,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p);
  }
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)&local_11f8);
  FileHandle::ReadLine_abi_cxx11_(local_1038,pFVar5);
  pcVar6 = __xpg_basename(local_1038[0]._M_dataplus._M_p);
  pcVar3 = local_11d0;
  strlen(pcVar6);
  ::std::__cxx11::string::_M_replace((ulong)&local_11d8,0,pcVar3,(ulong)pcVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((long *)local_11f8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_11f8._M_dataplus._M_p + 8))();
  }
  switchD_005700f1::default(local_1038,0,0x1000);
  local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1078,"/proc/%d/exe","");
  Exception::ConstructMessage<int>(&local_11f8,&local_1078,params_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  sVar7 = readlink(local_11f8._M_dataplus._M_p,(char *)local_1038,0x1000);
  pcVar3 = local_11d0;
  if (0 < sVar7) {
    strlen((char *)local_1038);
    ::std::__cxx11::string::_M_replace((ulong)&local_11d8,0,pcVar3,(ulong)local_1038);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f8._M_dataplus._M_p != &local_11f8.field_2) {
    operator_delete(local_11f8._M_dataplus._M_p);
  }
  local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1098,"/proc/%d/loginuid","");
  Exception::ConstructMessage<int>(local_1038,&local_1098,params_00);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100;
  (**(code **)(*(long *)this + 0x10))(&local_1208,this,local_1038,1,0x100,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p);
  }
  pFVar5 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                       *)&local_1208);
  FileHandle::ReadLine_abi_cxx11_(local_1038,pFVar5);
  __nptr._M_p = local_1038[0]._M_dataplus._M_p;
  piVar8 = __errno_location();
  iVar1 = *piVar8;
  *piVar8 = 0;
  lVar9 = strtol(__nptr._M_p,(char **)&local_11f8,10);
  if (local_11f8._M_dataplus._M_p == __nptr._M_p) {
    ::std::__throw_invalid_argument("stoi");
  }
  else if (((int)(__uid_t)lVar9 == lVar9) && (*piVar8 != 0x22)) {
    if (*piVar8 == 0) {
      *piVar8 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      operator_delete(local_1038[0]._M_dataplus._M_p);
    }
    ppVar10 = getpwuid((__uid_t)lVar9);
    pcVar3 = local_11b0;
    if (ppVar10 != (passwd *)0x0) {
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar10->pw_name
      ;
      params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 strlen((char *)params);
      ::std::__cxx11::string::_M_replace((ulong)&local_11b8,0,pcVar3,(ulong)params);
    }
    if (local_1208._M_head_impl != (FileHandle *)0x0) {
      (*(local_1208._M_head_impl)->_vptr_FileHandle[1])();
    }
    local_10b8[0] = local_10a8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_10b8,"Conflicting lock is held in %s%s","");
    pcVar3 = local_11d0;
    if (local_11d0 == (char *)0x0) {
      local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1138,"PID %d","");
      Exception::ConstructMessage<int>(&local_10d8,&local_1138,params_00);
    }
    else {
      local_10f8[0] = &local_10e8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_10f8,"%s (PID %d)","");
      local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1118,local_11d8,local_11d0 + (long)local_11d8);
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)fs & 0xffffffff);
      StringUtil::Format<std::__cxx11::string,int>
                (&local_10d8,(StringUtil *)local_10f8,&local_1118,params,(int)params_1);
    }
    pcVar6 = local_11b0;
    if (local_11b0 == (char *)0x0) {
      local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1198,anon_var_dwarf_643533f + 9);
    }
    else {
      local_1158[0] = local_1148;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1158," by user %s","");
      local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1178,local_11b8,local_11b0 + (long)local_11b8);
      StringUtil::Format<std::__cxx11::string>
                (&local_1198,(StringUtil *)local_1158,&local_1178,params);
    }
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (local_1200,(StringUtil *)local_10b8,&local_10d8,&local_1198,params_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
      operator_delete(local_1198._M_dataplus._M_p);
    }
    psVar2 = local_1200;
    if (pcVar6 != (char *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
        operator_delete(local_1178._M_dataplus._M_p);
      }
      if (local_1158[0] != local_1148) {
        operator_delete(local_1158[0]);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
      operator_delete(local_10d8._M_dataplus._M_p);
    }
    if (pcVar3 == (char *)0x0) {
      paVar11 = &local_1138.field_2;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
        operator_delete(local_1118._M_dataplus._M_p);
      }
      paVar11 = &local_10e8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar11->_M_local_buf + -0x10) != paVar11) {
      operator_delete(*(undefined1 **)(paVar11->_M_local_buf + -0x10));
    }
    if (local_10b8[0] != local_10a8) {
      operator_delete(local_10b8[0]);
    }
    if (local_11b8 != local_11a8) {
      operator_delete(local_11b8);
    }
    if (local_11d8 == local_11c8) {
      return psVar2;
    }
    operator_delete(local_11d8);
    return psVar2;
  }
  ::std::__throw_out_of_range("stoi");
}

Assistant:

static string AdditionalProcessInfo(FileSystem &fs, pid_t pid) {
	if (pid == getpid()) {
		return "Lock is already held in current process, likely another DuckDB instance";
	}
	string process_name, process_owner;

	try {
		auto cmdline_file = fs.OpenFile(StringUtil::Format("/proc/%d/cmdline", pid), FileFlags::FILE_FLAGS_READ);
		auto cmdline = cmdline_file->ReadLine();
		process_name = basename(const_cast<char *>(cmdline.c_str())); // NOLINT: old C API does not take const
	} catch (std::exception &) {
		// ignore
	}

	// we would like to provide a full path to the executable if possible but we might not have rights
	{
		char exe_target[PATH_MAX];
		memset(exe_target, '\0', PATH_MAX);
		auto proc_exe_link = StringUtil::Format("/proc/%d/exe", pid);
		auto readlink_n = readlink(proc_exe_link.c_str(), exe_target, PATH_MAX);
		if (readlink_n > 0) {
			process_name = exe_target;
		}
	}

	// try to find out who created that process
	try {
		auto loginuid_file = fs.OpenFile(StringUtil::Format("/proc/%d/loginuid", pid), FileFlags::FILE_FLAGS_READ);
		auto uid = std::stoi(loginuid_file->ReadLine());
		auto pw = getpwuid(uid);
		if (pw) {
			process_owner = pw->pw_name;
		}
	} catch (std::exception &) {
		// ignore
	}

	return StringUtil::Format("Conflicting lock is held in %s%s",
	                          !process_name.empty() ? StringUtil::Format("%s (PID %d)", process_name, pid)
	                                                : StringUtil::Format("PID %d", pid),
	                          !process_owner.empty() ? StringUtil::Format(" by user %s", process_owner) : "");
}